

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O1

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol,int start,int incr)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  undefined8 uVar5;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  int iVar13;
  int iVar14;
  undefined8 *puVar15;
  DataKey DVar16;
  long lVar17;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *tol;
  long lVar18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_20c;
  cpp_dec_float<100U,_int,_void> local_1e8;
  cpp_dec_float<100U,_int,_void> *local_190;
  cpp_dec_float<100U,_int,_void> local_188;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  byte local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar13 = (int)((long)(pSVar2->weights).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar4 >> 4) * -0x33333333
  ;
  local_1e8.fpclass = cpp_dec_float_finite;
  local_1e8.prec_elem = 0x10;
  local_1e8.data._M_elems[0] = 0;
  local_1e8.data._M_elems[1] = 0;
  local_1e8.data._M_elems[2] = 0;
  local_1e8.data._M_elems[3] = 0;
  local_1e8.data._M_elems[4] = 0;
  local_1e8.data._M_elems[5] = 0;
  local_1e8.data._M_elems[6] = 0;
  local_1e8.data._M_elems[7] = 0;
  local_1e8.data._M_elems[8] = 0;
  local_1e8.data._M_elems[9] = 0;
  local_1e8.data._M_elems[10] = 0;
  local_1e8.data._M_elems[0xb] = 0;
  local_1e8.data._M_elems[0xc] = 0;
  local_1e8.data._M_elems[0xd] = 0;
  local_1e8.data._M_elems._56_5_ = 0;
  local_1e8.data._M_elems[0xf]._1_3_ = 0;
  local_1e8.exp = 0;
  local_1e8.neg = false;
  local_20c = -1;
  local_190 = &best->m_backend;
  if (start < iVar13) {
    local_130 = &this->last;
    lVar17 = (long)start;
    lVar18 = lVar17 * 0x50;
    pnVar6 = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)incr * 0x50);
    local_20c = -1;
    do {
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar18);
      local_1e8.data._M_elems._0_8_ = *(undefined8 *)puVar1;
      local_1e8.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar18 + 0x10);
      local_1e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1e8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar18 + 0x20);
      local_1e8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_1e8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&(pnVar3->m_backend).data + lVar18 + 0x30);
      local_1e8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar5 = *(undefined8 *)(puVar1 + 2);
      local_1e8.data._M_elems._56_5_ = SUB85(uVar5,0);
      local_1e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_1e8.exp = *(int *)((long)&(pnVar3->m_backend).data + lVar18 + 0x40);
      local_1e8.neg = *(bool *)((long)&(pnVar3->m_backend).data + lVar18 + 0x44);
      local_1e8._72_8_ = *(undefined8 *)((long)&(pnVar3->m_backend).data + lVar18 + 0x48);
      local_188.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_188.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_188.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_188.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_188.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_188.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_188.data._M_elems._48_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_188.data._M_elems._56_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_188.exp = (feastol->m_backend).exp;
      local_188.neg = (feastol->m_backend).neg;
      local_188.fpclass = (feastol->m_backend).fpclass;
      local_188.prec_elem = (feastol->m_backend).prec_elem;
      if (local_188.data._M_elems[0] != 0 || local_188.fpclass != cpp_dec_float_finite) {
        local_188.neg = (bool)(local_188.neg ^ 1);
      }
      if (((local_188.fpclass != cpp_dec_float_NaN) &&
          (*(int *)((long)&(pnVar3->m_backend).data + lVar18 + 0x48) != 2)) &&
         (tol = pnVar6,
         iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                            ((cpp_dec_float<100U,_int,_void> *)
                             ((long)&(pnVar3->m_backend).data + lVar18),&local_188), iVar14 < 0)) {
        uStack_50 = CONCAT35(local_1e8.data._M_elems[0xf]._1_3_,local_1e8.data._M_elems._56_5_);
        local_88 = (devexpr  [8])local_1e8.data._M_elems._0_8_;
        auStack_80[0] = local_1e8.data._M_elems[2];
        auStack_80[1] = local_1e8.data._M_elems[3];
        local_78[0] = local_1e8.data._M_elems[4];
        local_78[1] = local_1e8.data._M_elems[5];
        auStack_70[0] = local_1e8.data._M_elems[6];
        auStack_70[1] = local_1e8.data._M_elems[7];
        local_68[0] = local_1e8.data._M_elems[8];
        local_68[1] = local_1e8.data._M_elems[9];
        auStack_60[0] = local_1e8.data._M_elems[10];
        auStack_60[1] = local_1e8.data._M_elems[0xb];
        local_58[0] = local_1e8.data._M_elems[0xc];
        local_58[1] = local_1e8.data._M_elems[0xd];
        local_48 = local_1e8.exp;
        local_44 = local_1e8.neg;
        local_40 = local_1e8.fpclass;
        iStack_3c = local_1e8.prec_elem;
        puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar18);
        local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar18 + 0x10);
        local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar18 + 0x20);
        local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&(pnVar4->m_backend).data + lVar18 + 0x30);
        local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_d8.m_backend.exp = *(int *)((long)&(pnVar4->m_backend).data + lVar18 + 0x40);
        local_d8.m_backend.neg = *(bool *)((long)&(pnVar4->m_backend).data + lVar18 + 0x44);
        local_d8.m_backend._72_8_ = *(undefined8 *)((long)&(pnVar4->m_backend).data + lVar18 + 0x48)
        ;
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_128.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_128.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_128.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_128.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_128.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_128.m_backend.exp = (feastol->m_backend).exp;
        local_128.m_backend.neg = (feastol->m_backend).neg;
        local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_188,local_88,&local_d8,&local_128,tol);
        local_1e8.data._M_elems[0xc] = local_188.data._M_elems[0xc];
        local_1e8.data._M_elems[0xd] = local_188.data._M_elems[0xd];
        local_1e8.data._M_elems._56_5_ = local_188.data._M_elems._56_5_;
        local_1e8.data._M_elems[0xf]._1_3_ = local_188.data._M_elems[0xf]._1_3_;
        local_1e8.data._M_elems[8] = local_188.data._M_elems[8];
        local_1e8.data._M_elems[9] = local_188.data._M_elems[9];
        local_1e8.data._M_elems[10] = local_188.data._M_elems[10];
        local_1e8.data._M_elems[0xb] = local_188.data._M_elems[0xb];
        local_1e8.data._M_elems[4] = local_188.data._M_elems[4];
        local_1e8.data._M_elems[5] = local_188.data._M_elems[5];
        local_1e8.data._M_elems[6] = local_188.data._M_elems[6];
        local_1e8.data._M_elems[7] = local_188.data._M_elems[7];
        local_1e8.data._M_elems[0] = local_188.data._M_elems[0];
        local_1e8.data._M_elems[1] = local_188.data._M_elems[1];
        local_1e8.data._M_elems[2] = local_188.data._M_elems[2];
        local_1e8.data._M_elems[3] = local_188.data._M_elems[3];
        local_1e8.exp = local_188.exp;
        local_1e8.neg = local_188.neg;
        local_1e8.fpclass = local_188.fpclass;
        local_1e8.prec_elem = local_188.prec_elem;
        if (((local_188.fpclass != cpp_dec_float_NaN) && (local_190->fpclass != cpp_dec_float_NaN))
           && (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (&local_1e8,local_190), 0 < iVar14)) {
          puVar15 = (undefined8 *)((long)&(pnVar4->m_backend).data + lVar18 + 0x48);
          *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 0xc) =
               local_1e8.data._M_elems._48_8_;
          *(ulong *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 0xe) =
               CONCAT35(local_1e8.data._M_elems[0xf]._1_3_,local_1e8.data._M_elems._56_5_);
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 8)
               = local_1e8.data._M_elems._32_8_;
          *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 10) =
               local_1e8.data._M_elems._40_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 4)
               = local_1e8.data._M_elems._16_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 6)
               = local_1e8.data._M_elems._24_8_;
          *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems =
               local_1e8.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 2)
               = local_1e8.data._M_elems._8_8_;
          local_190->exp = local_1e8.exp;
          local_190->neg = local_1e8.neg;
          local_190->fpclass = local_1e8.fpclass;
          local_190->prec_elem = local_1e8.prec_elem;
          uVar5 = puVar15[-9];
          uVar7 = puVar15[-8];
          uVar8 = puVar15[-7];
          uVar9 = puVar15[-6];
          uVar10 = puVar15[-5];
          uVar11 = puVar15[-4];
          uVar12 = puVar15[-2];
          *(undefined8 *)((local_130->m_backend).data._M_elems + 0xc) = puVar15[-3];
          *(undefined8 *)((local_130->m_backend).data._M_elems + 0xe) = uVar12;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 8) = uVar10;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 10) = uVar11;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 4) = uVar8;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 6) = uVar9;
          *(undefined8 *)(local_130->m_backend).data._M_elems = uVar5;
          *(undefined8 *)((local_130->m_backend).data._M_elems + 2) = uVar7;
          (this->last).m_backend.exp = *(int *)(puVar15 + -1);
          (this->last).m_backend.neg = *(bool *)((long)puVar15 + -4);
          uVar5 = *puVar15;
          (this->last).m_backend.fpclass = (int)uVar5;
          (this->last).m_backend.prec_elem = (int)((ulong)uVar5 >> 0x20);
          local_20c = (int)lVar17;
        }
      }
      lVar17 = lVar17 + incr;
      lVar18 = (long)(pnVar6->m_backend).data._M_elems + lVar18;
    } while (lVar17 < iVar13);
  }
  if (local_20c < 0) {
    DVar16.info = 0;
    DVar16.idx = -1;
  }
  else {
    DVar16 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::id((this->
                           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).thesolver,local_20c);
  }
  return (SPxId)DVar16;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseCoDim(R& best, R feastol, int start, int incr)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int end = this->thesolver->weights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->test().dim());

   for(; start < end; start += incr)
   {
      x = test[start];

      if(test[start] < -feastol)
      {
         x = devexpr::computePrice(x, pen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = pen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}